

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenUtilsEM64T.hpp
# Opt level: O0

void Centaurus::call_abs<void_const*(*)(void*,int,void_const*),asmjit::X86Gp,int,asmjit::X86Gp>
               (X86Assembler *as,_func_void_ptr_void_ptr_int_void_ptr *addr,X86Gp *args,int args_1,
               X86Gp *args_2)

{
  undefined4 instId;
  undefined8 this;
  undefined8 local_128;
  undefined8 o0;
  uint32_t instId_00;
  X86Gp *args_local_2;
  int args_local_1;
  X86Gp *args_local;
  _func_void_ptr_void_ptr_int_void_ptr *addr_local;
  X86Assembler *as_local;
  
  local_128 = (args->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0._packed[0];
  o0 = (args->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0._mem.field_2.offset64;
  instId = (undefined4)
           ((ulong)*(undefined8 *)
                    &(args_2->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0 >> 0x20);
  this = *(anon_union_8_2_78723da6_for_MemData_2 *)
          ((long)&(args_2->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0 + 8);
  push_arg<asmjit::X86Gp,int,asmjit::X86Gp>
            (as,(X86Gp *)&stack0xfffffffffffffed8,args_1,(X86Gp *)&stack0xfffffffffffffec8);
  instId_00 = (uint32_t)((ulong)args_2 >> 0x20);
  asmjit::CodeEmitter::emit((CodeEmitter *)this,instId,(Operand_ *)0x15e26f);
  asmjit::CodeEmitter::emit((CodeEmitter *)this,instId,(Operand_ *)0x15e2a9);
  asmjit::CodeEmitter::emit((CodeEmitter *)this,instId,(Operand_ *)0x15e2e3);
  asmjit::CodeEmitter::emit((CodeEmitter *)CONCAT44(args_1,args_local_2._0_4_),instId_00,o0);
  return;
}

Assistant:

static void call_abs(asmjit::X86Assembler& as, T addr, Ts... args)
{
	push_arg(as, args...);
	if (sizeof...(args) >= 1) as.pop(ARG1_REG);
	if (sizeof...(args) >= 2) as.pop(ARG2_REG);
	if (sizeof...(args) >= 3) as.pop(ARG3_REG);
	if (sizeof...(args) >= 4) as.pop(ARG4_REG);
	
#if defined(CENTAURUS_BUILD_WINDOWS)
	as.sub(asmjit::x86::rsp, 32);
#endif
	as.call(reinterpret_cast<uint64_t>(addr));
#if defined(CENTAURUS_BUILD_WINDOWS)
	as.add(asmjit::x86::rsp, 32);
#endif
}